

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graphics.cpp
# Opt level: O2

void __thiscall nite::Batch::unload(Batch *this)

{
  pointer ppBVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  uint i;
  ulong uVar5;
  
  clearBuffer(this);
  iVar3 = this->objectId;
  lVar4 = (long)iVar3;
  if ((-1 < lVar4) &&
     (batches.super__Vector_base<BatchT,_std::allocator<BatchT>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      batches.super__Vector_base<BatchT,_std::allocator<BatchT>_>._M_impl.super__Vector_impl_data.
      _M_start)) {
    ppBVar1 = batches.super__Vector_base<BatchT,_std::allocator<BatchT>_>._M_impl.
              super__Vector_impl_data._M_start[lVar4].owners.
              super__Vector_base<nite::Batch_*,_std::allocator<nite::Batch_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar2 = 0;
    do {
      uVar5 = uVar2;
      if ((ulong)((long)batches.super__Vector_base<BatchT,_std::allocator<BatchT>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar4].owners.
                        super__Vector_base<nite::Batch_*,_std::allocator<nite::Batch_*>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)ppBVar1 >> 3) <= uVar5)
      goto LAB_00188fb3;
      uVar2 = (ulong)((int)uVar5 + 1);
    } while (ppBVar1[uVar5] != this);
    std::vector<nite::Batch_*,_std::allocator<nite::Batch_*>_>::erase
              (&batches.super__Vector_base<BatchT,_std::allocator<BatchT>_>._M_impl.
                super__Vector_impl_data._M_start[lVar4].owners,(const_iterator)(ppBVar1 + uVar5));
    iVar3 = this->objectId;
LAB_00188fb3:
    if (batches.super__Vector_base<BatchT,_std::allocator<BatchT>_>._M_impl.super__Vector_impl_data.
        _M_start[iVar3].owners.super__Vector_base<nite::Batch_*,_std::allocator<nite::Batch_*>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        batches.super__Vector_base<BatchT,_std::allocator<BatchT>_>._M_impl.super__Vector_impl_data.
        _M_start[iVar3].owners.super__Vector_base<nite::Batch_*,_std::allocator<nite::Batch_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      BatchT::clear(batches.super__Vector_base<BatchT,_std::allocator<BatchT>_>._M_impl.
                    super__Vector_impl_data._M_start + iVar3);
    }
    this->objectId = -1;
  }
  return;
}

Assistant:

void nite::Batch::unload(){	
	clearBuffer();	
	if (objectId <= -1 || batches.size() == 0) return;
	for(unsigned i=0; i<batches[objectId].owners.size(); i++){
		if (batches[objectId].owners[i] == this){
			batches[objectId].owners.erase(batches[objectId].owners.begin()+i);
			break;
		}
	}
	if (batches[objectId].owners.size() == 0){
		batches[objectId].clear();
	}
  	objectId = -1;	
}